

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  JsonParse *pParse;
  byte *zPath_00;
  size_t sVar2;
  JsonNode *pJVar3;
  uchar *zPath_01;
  JsonNode *local_e8;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  JsonString jx;
  int flags;
  char *zPath;
  JsonNode *pNode;
  JsonParse *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  pvVar1 = sqlite3_user_data(ctx);
  jx._132_4_ = SUB84(pvVar1,0);
  if ((1 < argc) && (pParse = jsonParseCached(ctx,argv,ctx), pParse != (JsonParse *)0x0)) {
    if (argc == 2) {
      zPath_00 = sqlite3_value_text(argv[1]);
      if (zPath_00 != (byte *)0x0) {
        if ((jx._132_4_ & 3) == 0) {
          pJVar3 = jsonLookup(pParse,(char *)zPath_00,(int *)0x0,ctx);
          if ((pParse->nErr == '\0') && (pJVar3 != (JsonNode *)0x0)) {
            jsonReturn(pJVar3,ctx,(sqlite3_value **)0x0);
          }
        }
        else {
          if (*zPath_00 == 0x24) {
            zPath = (char *)jsonLookup(pParse,(char *)zPath_00,(int *)0x0,ctx);
          }
          else {
            jsonInit((JsonString *)local_c8,ctx);
            if ((""[*zPath_00] & 4) == 0) {
              jsonAppendRaw((JsonString *)local_c8,"$.",(*zPath_00 != 0x5b) + 1);
              sVar2 = strlen((char *)zPath_00);
              jsonAppendRaw((JsonString *)local_c8,(char *)zPath_00,(u32)sVar2);
              jsonAppendChar((JsonString *)local_c8,'\0');
            }
            else {
              jsonAppendRaw((JsonString *)local_c8,"$[",2);
              sVar2 = strlen((char *)zPath_00);
              jsonAppendRaw((JsonString *)local_c8,(char *)zPath_00,(u32)sVar2);
              jsonAppendRaw((JsonString *)local_c8,"]",2);
            }
            if (jx.nUsed._1_1_ == '\0') {
              local_e8 = jsonLookup(pParse,(char *)jx.pCtx,(int *)0x0,ctx);
            }
            else {
              local_e8 = (JsonNode *)0x0;
            }
            zPath = (char *)local_e8;
            jsonReset((JsonString *)local_c8);
          }
          if (zPath != (char *)0x0) {
            if ((jx._132_4_ & 1) == 0) {
              jsonReturn((JsonNode *)zPath,ctx,(sqlite3_value **)0x0);
              sqlite3_result_subtype(ctx,0);
            }
            else {
              jsonReturnJson((JsonNode *)zPath,ctx,(sqlite3_value **)0x0);
            }
          }
        }
      }
    }
    else {
      jsonInit((JsonString *)local_c8,ctx);
      jsonAppendChar((JsonString *)local_c8,'[');
      for (local_cc = 1; local_cc < argc; local_cc = local_cc + 1) {
        zPath_01 = sqlite3_value_text(argv[local_cc]);
        pJVar3 = jsonLookup(pParse,(char *)zPath_01,(int *)0x0,ctx);
        if (pParse->nErr != '\0') break;
        jsonAppendSeparator((JsonString *)local_c8);
        if (pJVar3 == (JsonNode *)0x0) {
          jsonAppendRaw((JsonString *)local_c8,"null",4);
        }
        else {
          jsonRenderNode(pJVar3,(JsonString *)local_c8,(sqlite3_value **)0x0);
        }
      }
      if (local_cc == argc) {
        jsonAppendChar((JsonString *)local_c8,']');
        jsonResult((JsonString *)local_c8);
        sqlite3_result_subtype(ctx,0x4a);
      }
      jsonReset((JsonString *)local_c8);
    }
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  JsonString jx;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  if( argc==2 ){
    /* With a single PATH argument */
    zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ) return;
    if( flags & JSON_ABPATH ){
      if( zPath[0]!='$' ){
        /* The -> and ->> operators accept abbreviated PATH arguments.  This
        ** is mostly for compatibility with PostgreSQL, but also for
        ** convenience.
        **
        **     NUMBER   ==>  $[NUMBER]     // PG compatible
        **     LABEL    ==>  $.LABEL       // PG compatible
        **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
        */
        jsonInit(&jx, ctx);
        if( sqlite3Isdigit(zPath[0]) ){
          jsonAppendRaw(&jx, "$[", 2);
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendRaw(&jx, "]", 2);
        }else{
          jsonAppendRaw(&jx, "$.", 1 + (zPath[0]!='['));
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendChar(&jx, 0);
        }
        pNode = jx.bErr ? 0 : jsonLookup(p, jx.zBuf, 0, ctx);
        jsonReset(&jx);
      }else{
        pNode = jsonLookup(p, zPath, 0, ctx);
      }
      if( pNode ){
        if( flags & JSON_JSON ){
          jsonReturnJson(pNode, ctx, 0);
        }else{
          jsonReturn(pNode, ctx, 0);
          sqlite3_result_subtype(ctx, 0);
        }
      }
    }else{
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr==0 && pNode ) jsonReturn(pNode, ctx, 0);
    }
  }else{
    /* Two or more PATH arguments results in a JSON array with each
    ** element of the array being the value selected by one of the PATHs */
    int i;
    jsonInit(&jx, ctx);
    jsonAppendChar(&jx, '[');
    for(i=1; i<argc; i++){
      zPath = (const char*)sqlite3_value_text(argv[i]);
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr ) break;
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }
    if( i==argc ){
      jsonAppendChar(&jx, ']');
      jsonResult(&jx);
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
    jsonReset(&jx);
  }
}